

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::run(SSPMSolver *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  uint *puVar6;
  ostream *poVar7;
  size_t sVar8;
  size_t sVar9;
  int depth;
  ulong uVar10;
  long lVar11;
  Game *pGVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint n_bits;
  
  pGVar12 = (this->super_Solver).game;
  uVar3 = pGVar12->n_vertices;
  uVar10 = 0x20;
  iVar5 = *(int *)((long)pGVar12->_priority + ((long)((uVar3 << 0x20) + -0x100000000) >> 0x1e));
  uVar13 = (uint)((uVar3 - 1 & uVar3) != 0);
  lVar11 = 0;
  uVar14 = uVar3;
  do {
    uVar15 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar11) & uVar14) != 0) {
      uVar15 = uVar10;
    }
    uVar13 = uVar13 + (int)uVar15;
    uVar14 = uVar14 >> uVar15;
    uVar10 = uVar10 >> 1;
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x30);
  (this->Q).pointer = 0;
  puVar6 = (this->Q).queue;
  depth = iVar5 / 2 + 1;
  iVar5 = (iVar5 + 1) - (iVar5 + 1 >> 0x1f) >> 1;
  if (puVar6 != (uint *)0x0) {
    operator_delete__(puVar6);
    pGVar12 = (this->super_Solver).game;
  }
  puVar6 = (uint *)operator_new__((uVar3 & 0xffffffff) << 2);
  (this->Q).queue = puVar6;
  bitset::resize(&this->dirty,pGVar12->n_vertices);
  bitset::resize(&this->unstable,((this->super_Solver).game)->n_vertices);
  poVar7 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"even wants ",0xb);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-bounded adaptive ",0x12);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,depth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-counters.",10);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"odd wants ",10);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-bounded adaptive ",0x12);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-counters.",10);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  n_bits = 1;
  if (this->bounded == false) {
    n_bits = uVar13;
  }
  if (n_bits <= uVar13) {
    while( true ) {
      pGVar12 = (this->super_Solver).game;
      iVar1 = this->lift_attempt;
      iVar2 = this->lift_count;
      lVar11 = pGVar12->n_vertices;
      sVar8 = bitset::count(&pGVar12->solved);
      run(this,n_bits,iVar5,1);
      pGVar12 = (this->super_Solver).game;
      sVar4 = pGVar12->n_vertices;
      sVar9 = bitset::count(&pGVar12->solved);
      poVar7 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"after odd  with k=",0x12);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,n_bits);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_count - iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," lifts, ",8);
      *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_attempt - iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," lift attempts, ",0x10);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," unsolved left.",0xf);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (sVar4 == sVar9) break;
      run(this,n_bits,depth,0);
      pGVar12 = (this->super_Solver).game;
      sVar4 = pGVar12->n_vertices;
      sVar9 = bitset::count(&pGVar12->solved);
      poVar7 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"after even with k=",0x12);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,n_bits);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_count - iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," lifts, ",8);
      *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 9;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_attempt - iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," lift attempts, ",0x10);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," unsolved left.",0xf);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (((n_bits == uVar13) || (sVar4 == sVar9)) ||
         (n_bits = (n_bits - (lVar11 - sVar8 != sVar4 - sVar9)) + 1, (int)uVar13 < (int)n_bits))
      break;
    }
  }
  poVar7 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"solved with ",0xc);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," lifts, ",8);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->lift_attempt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," lift attempts, max l ",0x16);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,n_bits);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return;
}

Assistant:

void
SSPMSolver::run()
{
    int max_prio = priority(nodecount()-1);

    // compute ml (max l) and the h for even/odd
    int ml = ceil_log2(nodecount());
    int h0 = (max_prio/2)+1;
    int h1 = (max_prio+1)/2;

    // create datastructures
    Q.resize(nodecount());
    dirty.resize(nodecount());
    unstable.resize(nodecount());

    logger << "even wants " << ml << "-bounded adaptive " << h0 << "-counters." << std::endl;
    logger << "odd wants " << ml << "-bounded adaptive " << h1 << "-counters." << std::endl;

    // if running bounded sspm, start with 1-bounded adaptive counters
    int i = bounded ? 1 : ml;

    for (; i<=ml; i++) {
        int _l = lift_count, _a = lift_attempt;
        uint64_t _c = game.count_unsolved(), c;

        if (ODDFIRST) {
            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        } else {
            // run even counters
            run(i, h0, 0);
            c = game.count_unsolved();
            logger << "after even with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;

            // if now solved, no need to run odd counters
            if (c == 0) break;

            // run odd counters
            run(i, h1, 1);
            c = game.count_unsolved();
            logger << "after odd  with k=" << i << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
        }

        if (i != ml) {
            // if i == ml then we are guaranteed to be done
            // otherwise check if done
            if (c == 0) break;
            if (_c != c) i--; // do not increase i if we solved vertices with current i
        } else {
            break; // do not count higher pls
        }
    }

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max l " << i << "." << std::endl;
}